

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall helics::BrokerBase::configureBase(BrokerBase *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  pointer __args;
  pointer this_00;
  thread *in_RDI;
  string *in_stack_000000e8;
  LogManager *in_stack_000000f0;
  memory_order __b;
  undefined6 in_stack_fffffffffffffed8;
  BrokerState in_stack_fffffffffffffede;
  LogManager *in_stack_fffffffffffffee0;
  thread *this_01;
  unique_ptr<helics::AsyncTimeCoordinator,_std::default_delete<helics::AsyncTimeCoordinator>_>
  *in_stack_fffffffffffffee8;
  LogManager *this_02;
  function<void_(helics::ActionMessage_&&)> *in_stack_fffffffffffffef0;
  LogManager *pLVar4;
  type *__f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  type local_78 [12];
  int local_18;
  memory_order local_14;
  int local_10;
  int local_c;
  LogManager *local_8;
  
  if ((in_RDI[0x1a]._M_id._M_thread & 0x1000000) != 0) {
    *(undefined1 *)((long)&in_RDI[0x41]._M_id._M_thread + 5) = 1;
    *(undefined1 *)((long)&in_RDI[0x1b]._M_id._M_thread + 4) = 1;
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                    ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 8),
                     (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
  if (bVar1) {
    TimeRepresentation<count_time<9,_long>_>::operator=
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffee0,
               (double)CONCAT26(in_stack_fffffffffffffede,in_stack_fffffffffffffed8));
  }
  if (((in_RDI[0x41]._M_id._M_thread & 1) == 0) &&
     (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5175a5),
     bVar1)) {
    genId_abi_cxx11_();
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(&in_stack_fffffffffffffee0->logIdentifier);
  }
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (in_RDI + 0xd));
  if ((((sVar2 == 0x24) &&
       (pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (&in_stack_fffffffffffffee0->logIdentifier,
                            CONCAT26(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
       *pvVar3 == '-')) &&
      (pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::operator[](&in_stack_fffffffffffffee0->logIdentifier,
                             CONCAT26(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
      *pvVar3 == '-')) &&
     ((pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::operator[](&in_stack_fffffffffffffee0->logIdentifier,
                             CONCAT26(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
      *pvVar3 == '-' &&
      (pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::operator[](&in_stack_fffffffffffffee0->logIdentifier,
                             CONCAT26(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
      *pvVar3 == '-')))) {
    *(undefined1 *)((long)&in_RDI[0x41]._M_id._M_thread + 6) = 1;
  }
  if ((in_RDI[0x1a]._M_id._M_thread & 0x1000000000000) == 0) {
    if ((in_RDI[0x1a]._M_id._M_thread & 0x10000000000) == 0) {
      CLI::std::make_unique<helics::ForwardingTimeCoordinator>();
      std::unique_ptr<helics::BaseTimeCoordinator,std::default_delete<helics::BaseTimeCoordinator>>
      ::operator=((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   *)in_stack_fffffffffffffef0,
                  (unique_ptr<helics::ForwardingTimeCoordinator,_std::default_delete<helics::ForwardingTimeCoordinator>_>
                   *)in_stack_fffffffffffffee8);
      CLI::std::
      unique_ptr<helics::ForwardingTimeCoordinator,_std::default_delete<helics::ForwardingTimeCoordinator>_>
      ::~unique_ptr((unique_ptr<helics::ForwardingTimeCoordinator,_std::default_delete<helics::ForwardingTimeCoordinator>_>
                     *)in_stack_fffffffffffffee0);
    }
    else {
      CLI::std::make_unique<helics::GlobalTimeCoordinator>();
      std::unique_ptr<helics::BaseTimeCoordinator,std::default_delete<helics::BaseTimeCoordinator>>
      ::operator=((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   *)in_stack_fffffffffffffef0,
                  (unique_ptr<helics::GlobalTimeCoordinator,_std::default_delete<helics::GlobalTimeCoordinator>_>
                   *)in_stack_fffffffffffffee8);
      CLI::std::
      unique_ptr<helics::GlobalTimeCoordinator,_std::default_delete<helics::GlobalTimeCoordinator>_>
      ::~unique_ptr((unique_ptr<helics::GlobalTimeCoordinator,_std::default_delete<helics::GlobalTimeCoordinator>_>
                     *)in_stack_fffffffffffffee0);
      *(undefined1 *)((long)&in_RDI[0x41]._M_id._M_thread + 1) = 1;
    }
  }
  else {
    CLI::std::make_unique<helics::AsyncTimeCoordinator>();
    std::unique_ptr<helics::BaseTimeCoordinator,std::default_delete<helics::BaseTimeCoordinator>>::
    operator=((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    CLI::std::
    unique_ptr<helics::AsyncTimeCoordinator,_std::default_delete<helics::AsyncTimeCoordinator>_>::
    ~unique_ptr((unique_ptr<helics::AsyncTimeCoordinator,_std::default_delete<helics::AsyncTimeCoordinator>_>
                 *)in_stack_fffffffffffffee0);
    *(undefined1 *)((long)&in_RDI[0x41]._M_id._M_thread + 1) = 1;
  }
  __args = CLI::std::
           unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                         *)0x517752);
  __f = local_78;
  std::function<void(helics::ActionMessage_const&)>::
  function<helics::BrokerBase::configureBase()::__0,void>
            ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffef0,
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffee8);
  BaseTimeCoordinator::setMessageSender
            ((BaseTimeCoordinator *)in_stack_fffffffffffffee0,
             (function<void_(const_helics::ActionMessage_&)> *)
             CONCAT26(in_stack_fffffffffffffede,in_stack_fffffffffffffed8));
  CLI::std::function<void_(const_helics::ActionMessage_&)>::~function
            ((function<void_(const_helics::ActionMessage_&)> *)0x51779f);
  this_00 = CLI::std::
            unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
            ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                          *)0x5177b0);
  BaseTimeCoordinator::setRestrictivePolicy
            (this_00,(bool)(*(byte *)((long)&in_RDI[0x1a]._M_id._M_thread + 1) & 1));
  CLI::std::__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5177d8);
  std::function<void(helics::ActionMessage&&)>::
  function<helics::BrokerBase::configureBase()::__1,void>
            (in_stack_fffffffffffffef0,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffffee8);
  LogManager::setTransmitCallback
            (in_stack_fffffffffffffee0,
             (function<void_(helics::ActionMessage_&&)> *)
             CONCAT26(in_stack_fffffffffffffede,in_stack_fffffffffffffed8));
  CLI::std::function<void_(helics::ActionMessage_&&)>::~function
            ((function<void_(helics::ActionMessage_&&)> *)0x517819);
  this_01 = in_RDI + 0x3f;
  CLI::std::__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x51782f);
  LogManager::initializeLogging(in_stack_000000f0,in_stack_000000e8);
  this_02 = (LogManager *)((long)&in_RDI[2]._M_id._M_thread + 4);
  CLI::std::__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::LogManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x517858);
  local_c = LogManager::getMaxLevel(this_02);
  local_10 = 5;
  pLVar4 = this_02;
  local_8 = this_02;
  local_14 = CLI::std::operator&(seq_cst,__memory_order_mask);
  local_18 = local_c;
  if (local_10 == 3) {
    *(int *)&(pLVar4->logIdentifier)._M_dataplus._M_p = local_c;
  }
  else if (local_10 == 5) {
    LOCK();
    *(int *)&(pLVar4->logIdentifier)._M_dataplus._M_p = local_c;
    UNLOCK();
  }
  else {
    *(int *)&(pLVar4->logIdentifier)._M_dataplus._M_p = local_c;
  }
  CLI::std::atomic<bool>::store
            ((atomic<bool> *)this_02,SUB81((ulong)this_01 >> 0x38,0),(memory_order)this_01);
  std::thread::thread<void(helics::BrokerBase::*)(),helics::BrokerBase*,void>
            (in_RDI,__f,(BrokerBase **)__args);
  CLI::std::thread::operator=
            (this_01,(thread *)CONCAT26(in_stack_fffffffffffffede,in_stack_fffffffffffffed8));
  CLI::std::thread::~thread((thread *)0x51796b);
  CLI::std::atomic<helics::BrokerBase::BrokerState>::operator=
            ((atomic<helics::BrokerBase::BrokerState> *)this_01,in_stack_fffffffffffffede);
  return;
}

Assistant:

void BrokerBase::configureBase()
{
    if (debugging) {
        no_ping = true;
        disable_timer = true;
    }
    if (networkTimeout < timeZero) {
        networkTimeout = 4.0;
    }

    if (!noAutomaticID) {
        if (identifier.empty()) {
            identifier = genId();
        }
    }

    if (identifier.size() == 36) {
        if (identifier[8] == '-' && identifier[12] == '-' && identifier[16] == '-' &&
            identifier[20] == '-') {
            uuid_like = true;
        }
    }
    if (asyncTime) {
        timeCoord = std::make_unique<AsyncTimeCoordinator>();
        hasTimeDependency = true;
    } else if (globalTime) {
        timeCoord = std::make_unique<GlobalTimeCoordinator>();
        hasTimeDependency = true;
    } else {
        timeCoord = std::make_unique<ForwardingTimeCoordinator>();
    }

    timeCoord->setMessageSender([this](const ActionMessage& msg) { addActionMessage(msg); });
    timeCoord->setRestrictivePolicy(restrictive_time_policy);

    mLogManager->setTransmitCallback([this](ActionMessage&& message) {
        if (getBrokerState() < BrokerState::TERMINATING) {
            message.source_id = global_id.load();
            addActionMessage(std::move(message));
        }
    });
    mLogManager->initializeLogging(identifier);
    maxLogLevel.store(mLogManager->getMaxLevel());
    mainLoopIsRunning.store(true);
    queueProcessingThread = std::thread(&BrokerBase::queueProcessingLoop, this);
    brokerState = BrokerState::CONFIGURED;
}